

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmAddDependenciesCommand.cxx
# Opt level: O2

bool __thiscall
cmAddDependenciesCommand::InitialPass
          (cmAddDependenciesCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  cmMakefile *pcVar1;
  bool bVar2;
  ostream *poVar3;
  cmTarget *this_00;
  pointer pbVar4;
  string *this_01;
  ulong uVar5;
  string local_1e0;
  string target_name;
  ostringstream e;
  
  pbVar4 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar5 = (long)(args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar4;
  if (uVar5 < 0x21) {
    std::__cxx11::string::string
              ((string *)&e,"called with incorrect number of arguments",(allocator *)&target_name);
    cmCommand::SetError(&this->super_cmCommand,(string *)&e);
    this_01 = (string *)&e;
  }
  else {
    std::__cxx11::string::string((string *)&target_name,(string *)pbVar4);
    bVar2 = cmMakefile::IsAlias((this->super_cmCommand).Makefile,&target_name);
    if (bVar2) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
      poVar3 = std::operator<<((ostream *)&e,
                               "Cannot add target-level dependencies to alias target \"");
      poVar3 = std::operator<<(poVar3,(string *)&target_name);
      std::operator<<(poVar3,"\".\n");
      pcVar1 = (this->super_cmCommand).Makefile;
      std::__cxx11::stringbuf::str();
      cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_1e0);
      std::__cxx11::string::~string((string *)&local_1e0);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
    }
    this_00 = cmMakefile::FindTargetToUse((this->super_cmCommand).Makefile,&target_name,false);
    if (this_00 == (cmTarget *)0x0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
      poVar3 = std::operator<<((ostream *)&e,
                               "Cannot add target-level dependencies to non-existent target \"");
      poVar3 = std::operator<<(poVar3,(string *)&target_name);
      poVar3 = std::operator<<(poVar3,"\".\n");
      poVar3 = std::operator<<(poVar3,
                               "The add_dependencies works for top-level logical targets created ");
      poVar3 = std::operator<<(poVar3,
                               "by the add_executable, add_library, or add_custom_target commands.  "
                              );
      poVar3 = std::operator<<(poVar3,
                               "If you want to add file-level dependencies see the DEPENDS option ")
      ;
      std::operator<<(poVar3,"of the add_custom_target and add_custom_command commands.");
      pcVar1 = (this->super_cmCommand).Makefile;
      std::__cxx11::stringbuf::str();
      cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&local_1e0);
      std::__cxx11::string::~string((string *)&local_1e0);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
    }
    else {
      pbVar4 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      while (pbVar4 = pbVar4 + 1,
            pbVar4 != (args->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish) {
        cmTarget::AddUtility(this_00,pbVar4,(this->super_cmCommand).Makefile);
      }
    }
    this_01 = &target_name;
  }
  std::__cxx11::string::~string((string *)this_01);
  return 0x20 < uVar5;
}

Assistant:

bool cmAddDependenciesCommand
::InitialPass(std::vector<std::string> const& args, cmExecutionStatus &)
{
  if(args.size() < 2 )
    {
    this->SetError("called with incorrect number of arguments");
    return false;
    }

  std::string target_name = args[0];
  if(this->Makefile->IsAlias(target_name))
    {
    std::ostringstream e;
    e << "Cannot add target-level dependencies to alias target \""
      << target_name << "\".\n";
    this->Makefile->IssueMessage(cmake::FATAL_ERROR, e.str());
    }
  if(cmTarget* target = this->Makefile->FindTargetToUse(target_name))
    {
    std::vector<std::string>::const_iterator s = args.begin();
    ++s; // skip over target_name
    for (; s != args.end(); ++s)
      {
      target->AddUtility(*s, this->Makefile);
      }
    }
  else
    {
    std::ostringstream e;
    e << "Cannot add target-level dependencies to non-existent target \""
      << target_name << "\".\n"
      << "The add_dependencies works for top-level logical targets created "
      << "by the add_executable, add_library, or add_custom_target commands.  "
      << "If you want to add file-level dependencies see the DEPENDS option "
      << "of the add_custom_target and add_custom_command commands.";
    this->Makefile->IssueMessage(cmake::FATAL_ERROR, e.str());
    }

  return true;
}